

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
          (EncodedDescriptorDatabase *this,string *symbol_name,string *output)

{
  uint32 uVar1;
  MessageFactory *buffer;
  string *psVar2;
  pair<const_void_*,_int> pVar3;
  undefined1 local_1a8 [8];
  FileDescriptorProto file_proto;
  undefined1 auStack_b8 [4];
  uint32 kNameTag;
  CodedInputStream input;
  pair<const_void_*,_int> encoded_file;
  string *output_local;
  string *symbol_name_local;
  EncodedDescriptorDatabase *this_local;
  uint32 local_1c;
  uint32 v;
  uint32 local_c;
  
  pVar3 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindSymbol
                    (&this->index_,symbol_name);
  buffer = (MessageFactory *)pVar3.first;
  if (buffer == (MessageFactory *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    input.extension_factory_ = buffer;
    io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)auStack_b8,(uint8 *)buffer,pVar3.second);
    uVar1 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    local_1c = 0;
    if ((_auStack_b8 < input.buffer_) && (local_1c = (uint32)*_auStack_b8, local_1c < 0x80)) {
      io::CodedInputStream::Advance((CodedInputStream *)auStack_b8,1);
      local_c = local_1c;
    }
    else {
      local_c = io::CodedInputStream::ReadTagFallback((CodedInputStream *)auStack_b8,local_1c);
    }
    if (local_c == uVar1) {
      this_local._7_1_ = internal::WireFormatLite::ReadString((CodedInputStream *)auStack_b8,output)
      ;
      file_proto.source_code_info_._0_4_ = 1;
    }
    else {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1a8);
      this_local._7_1_ = MessageLite::ParseFromArray((MessageLite *)local_1a8,buffer,pVar3.second);
      if (this_local._7_1_) {
        psVar2 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_1a8);
        std::__cxx11::string::operator=((string *)output,(string *)psVar2);
      }
      file_proto.source_code_info_._0_4_ = 1;
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1a8);
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)auStack_b8);
  }
  return this_local._7_1_;
}

Assistant:

bool EncodedDescriptorDatabase::FindNameOfFileContainingSymbol(
    const string& symbol_name,
    string* output) {
  std::pair<const void*, int> encoded_file = index_.FindSymbol(symbol_name);
  if (encoded_file.first == NULL) return false;

  // Optimization:  The name should be the first field in the encoded message.
  //   Try to just read it directly.
  io::CodedInputStream input(reinterpret_cast<const uint8*>(encoded_file.first),
                             encoded_file.second);

  const uint32 kNameTag = internal::WireFormatLite::MakeTag(
      FileDescriptorProto::kNameFieldNumber,
      internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

  if (input.ReadTagNoLastTag() == kNameTag) {
    // Success!
    return internal::WireFormatLite::ReadString(&input, output);
  } else {
    // Slow path.  Parse whole message.
    FileDescriptorProto file_proto;
    if (!file_proto.ParseFromArray(encoded_file.first, encoded_file.second)) {
      return false;
    }
    *output = file_proto.name();
    return true;
  }
}